

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbol.hh
# Opt level: O1

Kind __thiscall
avro::parsing::SimpleParser<avro::parsing::DummyHandler>::advance
          (SimpleParser<avro::parsing::DummyHandler> *this,Kind k)

{
  stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
  *this_00;
  Kind actual;
  element_type *peVar1;
  bool bVar2;
  tuple<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>
  *ptVar3;
  weak_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_> *pwVar4;
  shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_> *psVar5;
  tuple<unsigned_long,_bool,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>
  *ptVar6;
  pair<avro::parsing::Symbol::Kind,_avro::parsing::Symbol::Kind> *ppVar7;
  ostream *poVar8;
  undefined8 *puVar9;
  _Elt_pointer pSVar10;
  value_type *pvVar11;
  pointer pSVar12;
  ProductionPtr pp;
  Kind local_1cc;
  weak_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
  local_1c8 [2];
  undefined1 local_1a8 [8];
  shared_count local_1a0 [46];
  
  this_00 = &this->parsingStack;
  do {
    pSVar10 = (this->parsingStack).c.
              super__Deque_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pSVar10 ==
        (this->parsingStack).c.
        super__Deque_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      pSVar10 = (this->parsingStack).c.
                super__Deque_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
    }
    actual = pSVar10[-1].kind_;
    if (actual == k) {
      std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::pop_back
                (&this_00->c);
      bVar2 = true;
      local_1cc = k;
      goto LAB_001951cd;
    }
    if (actual - sNull < 0xf) {
      throwMismatch(k,actual);
      goto LAB_001951cb;
    }
    switch(actual) {
    case sRoot:
      ptVar3 = boost::
               any_cast<boost::tuples::tuple<boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>,boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>>
                         (&pSVar10[-1].extra_);
      peVar1 = (ptVar3->super_type).head.px;
      pSVar12 = (peVar1->
                super__Vector_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>).
                _M_impl.super__Vector_impl_data._M_start;
      if (pSVar12 ==
          (peVar1->super__Vector_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>
          )._M_impl.super__Vector_impl_data._M_finish) goto LAB_001951cb;
      do {
        std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::push_back
                  (&this_00->c,pSVar12);
        pSVar12 = pSVar12 + 1;
        bVar2 = false;
      } while (pSVar12 !=
               (((ptVar3->super_type).head.px)->
               super__Vector_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>).
               _M_impl.super__Vector_impl_data._M_finish);
      break;
    case sRepeater:
      ptVar6 = boost::
               any_cast<boost::tuples::tuple<unsigned_long,bool,boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>,boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>>
                         (&pSVar10[-1].extra_);
      (ptVar6->super_type).head = (ptVar6->super_type).head - 1;
      peVar1 = (ptVar6->super_type).tail.tail.head.px;
      pSVar12 = (peVar1->
                super__Vector_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>).
                _M_impl.super__Vector_impl_data._M_start;
      if (pSVar12 ==
          (peVar1->super__Vector_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>
          )._M_impl.super__Vector_impl_data._M_finish) goto LAB_001951cb;
      do {
        std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::push_back
                  (&this_00->c,pSVar12);
        pSVar12 = pSVar12 + 1;
        bVar2 = false;
      } while (pSVar12 !=
               (((ptVar6->super_type).tail.tail.head.px)->
               super__Vector_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>).
               _M_impl.super__Vector_impl_data._M_finish);
      break;
    case sIndirect:
      psVar5 = boost::
               any_cast<boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>const&>
                         (&pSVar10[-1].extra_);
      local_1a8 = (undefined1  [8])psVar5->px;
      local_1a0[0].pi_ = (psVar5->pn).pi_;
      if (local_1a0[0].pi_ != (sp_counted_base *)0x0) {
        LOCK();
        (local_1a0[0].pi_)->use_count_ = (local_1a0[0].pi_)->use_count_ + 1;
        UNLOCK();
      }
      std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::pop_back
                (&this_00->c);
      for (pvVar11 = *(value_type **)local_1a8; pvVar11 != *(pointer *)((long)local_1a8 + 8);
          pvVar11 = pvVar11 + 1) {
        std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::push_back
                  (&this_00->c,pvVar11);
      }
      goto LAB_00195106;
    case sSymbolic:
      pwVar4 = boost::
               any_cast<boost::weak_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>const&>
                         (&pSVar10[-1].extra_);
      local_1c8[0].px = pwVar4->px;
      local_1c8[0].pn.pi_ = (pwVar4->pn).pi_;
      if (local_1c8[0].pn.pi_ != (sp_counted_base *)0x0) {
        LOCK();
        (local_1c8[0].pn.pi_)->weak_count_ = (local_1c8[0].pn.pi_)->weak_count_ + 1;
        UNLOCK();
      }
      boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>::
      shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>
                ((shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>
                  *)local_1a8,local_1c8);
      boost::detail::weak_count::~weak_count(&local_1c8[0].pn);
      std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::pop_back
                (&this_00->c);
      for (pvVar11 = *(value_type **)local_1a8; pvVar11 != *(pointer *)((long)local_1a8 + 8);
          pvVar11 = pvVar11 + 1) {
        std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::push_back
                  (&this_00->c,pvVar11);
      }
LAB_00195106:
      boost::detail::shared_count::~shared_count(local_1a0);
      goto LAB_001951cb;
    case sSkipStart:
      std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::pop_back
                (&this_00->c);
      skip(this,this->decoder_);
      goto LAB_001951cb;
    case sResolve:
      ppVar7 = boost::any_cast<std::pair<avro::parsing::Symbol::Kind,avro::parsing::Symbol::Kind>>
                         (&pSVar10[-1].extra_);
      if (ppVar7->second != k) {
        throwMismatch(ppVar7->second,k);
      }
      local_1cc = ppVar7->first;
      std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::pop_back
                (&this_00->c);
      bVar2 = true;
      break;
    default:
      if (actual == sError) {
        puVar9 = (undefined8 *)__cxa_allocate_exception(0x18);
        Symbol::extra<std::__cxx11::string>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                   pSVar10 + -1);
        std::runtime_error::runtime_error((runtime_error *)(puVar9 + 1),(string *)local_1a8);
        *puVar9 = 0x1cd6f0;
        puVar9[1] = 0x1cd720;
        __cxa_throw(puVar9,&Exception::typeinfo,Exception::~Exception);
      }
    case sAlternative:
    case sPlaceholder:
    case sEnumAdjust:
    case sUnionAdjust:
      if (7 < actual - sRecordStart) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Encountered ",0xc);
        poVar8 = std::operator<<((ostream *)local_1a8,
                                 *(char **)(Symbol::stringValues + (ulong)pSVar10[-1].kind_ * 8));
        std::__ostream_insert<char,std::char_traits<char>>(poVar8," while looking for ",0x13);
        std::operator<<(poVar8,*(char **)(Symbol::stringValues + (ulong)k * 8));
        puVar9 = (undefined8 *)__cxa_allocate_exception(0x18);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error((runtime_error *)(puVar9 + 1),(string *)local_1c8);
        *puVar9 = 0x1cd6f0;
        puVar9[1] = 0x1cd720;
        __cxa_throw(puVar9,&Exception::typeinfo,Exception::~Exception);
      }
      std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::pop_back
                (&this_00->c);
      if (actual == sWriterUnion) {
        bVar2 = false;
        selectBranch(this,0);
      }
      else {
LAB_001951cb:
        bVar2 = false;
      }
    }
LAB_001951cd:
    if (bVar2) {
      return local_1cc;
    }
  } while( true );
}

Assistant:

Symbol::Kind advance(Symbol::Kind k) {
        for (; ;) {
            Symbol& s = parsingStack.top();
            if (s.kind() == k) {
                parsingStack.pop();
                return k;
            } else if (s.isTerminal()) {
                throwMismatch(k, s.kind());
            } else {
                switch (s.kind()) {
                case Symbol::sRoot:
                    append(boost::tuples::get<0>(*s.extrap<RootInfo>()));
                    continue;
                case Symbol::sIndirect:
                    {
                        ProductionPtr pp =
                            s.extra<ProductionPtr>();
                        parsingStack.pop();
                        append(pp);
                    }
                    continue;
                case Symbol::sSymbolic:
                    {
                        ProductionPtr pp(
                            s.extra<boost::weak_ptr<Production> >());
                        parsingStack.pop();
                        append(pp);
                    }
                    continue;
                case Symbol::sRepeater:
                    {
                        RepeaterInfo *p = s.extrap<RepeaterInfo>();
                        --boost::tuples::get<0>(*p);
                        append(boost::tuples::get<2>(*p));
                    }
                    continue;
                case Symbol::sError:
                    throw Exception(s.extra<std::string>());
                case Symbol::sResolve:
                    {
                        const std::pair<Symbol::Kind, Symbol::Kind>* p =
                            s.extrap<std::pair<Symbol::Kind, Symbol::Kind> >();
                        assertMatch(p->second, k);
                        Symbol::Kind result = p->first;
                        parsingStack.pop();
                        return result;
                    }
                case Symbol::sSkipStart:
                    parsingStack.pop();
                    skip(*decoder_);
                    break;
                default:
                    if (s.isImplicitAction()) {
                        size_t n = handler_.handle(s);
                        if (s.kind() == Symbol::sWriterUnion) {
                            parsingStack.pop();
                            selectBranch(n); 
                        } else {
                            parsingStack.pop();
                        }
                    } else {
                        std::ostringstream oss;
                        oss << "Encountered " << Symbol::toString(s.kind())
                            << " while looking for " << Symbol::toString(k);
                        throw Exception(oss.str());
                    }
                }
            }
        }
    }